

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opal.cpp
# Opt level: O1

bool Am_Is_Group_Or_Map(Am_Object *obj)

{
  bool bVar1;
  bool bVar2;
  Am_Object local_30;
  Am_Object local_28;
  
  Am_Object::Am_Object(&local_28,&Am_Group);
  bVar1 = Am_Object::Is_Instance_Of(obj,&local_28);
  Am_Object::~Am_Object(&local_28);
  bVar2 = true;
  if (!bVar1) {
    if (Am_Map_ptr == (Am_Object *)0x0) {
      bVar2 = false;
    }
    else {
      Am_Object::Am_Object(&local_30,Am_Map_ptr);
      bVar2 = Am_Object::Is_Instance_Of(obj,&local_30);
      Am_Object::~Am_Object(&local_30);
    }
  }
  return bVar2;
}

Assistant:

bool
Am_Is_Group_Or_Map(Am_Object &obj)
{
  if (obj.Is_Instance_Of(Am_Group))
    return true;

  //
  // If Am_Map_ptr is not set, then there are no Am_Maps in this
  // application, so we don't have to check to see if `obj' is an Am_Map.
  //
  if (Am_Map_ptr && obj.Is_Instance_Of(*Am_Map_ptr))
    return true;

  return false;
}